

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O3

LevenshteinDFA *
la::LevenshteinDFA::SubsetConstruct(LevenshteinDFA *__return_storage_ptr__,LevenshteinNFA *nfa)

{
  list<int,_std::allocator<int>_> *plVar1;
  _Rb_tree_header *p_Var2;
  size_t *psVar3;
  undefined1 uVar4;
  int iVar5;
  mapped_type mVar6;
  pair<int,_char> pVar7;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var8;
  pair<int,_char> pVar9;
  LevenshteinNFA *nfa_00;
  _List_node_base *p_Var10;
  _Node *p_Var11;
  mapped_type *pmVar12;
  _List_node_base *p_Var13;
  _Fwd_list_node_base *p_Var14;
  _Base_ptr p_Var15;
  iterator iVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  ulong uVar19;
  _List_node_base *p_Var20;
  ulong uVar21;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var22;
  int iVar23;
  long lVar24;
  vector<std::pair<std::pair<int,_char>,_int>,_std::allocator<std::pair<std::pair<int,_char>,_int>_>_>
  vec_tmp;
  list<int,_std::allocator<int>_> aState;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  unmarkedStates;
  list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  markedStates;
  list<int,_std::allocator<int>_> first;
  list<int,_std::allocator<int>_> next;
  list<int,_std::allocator<int>_> nfaInitial;
  map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  dfaStateNum;
  pair<std::pair<int,_char>,_int> *local_178;
  iterator iStack_170;
  pair<std::pair<int,_char>,_int> *local_168;
  LevenshteinDFA *local_160;
  list<char,_std::allocator<char>_> *local_158;
  uint local_14c;
  pair<std::pair<int,_char>,_int> local_148 [2];
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_130;
  list<int,_std::allocator<int>_> local_128;
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  local_110;
  LevenshteinNFA *local_f8;
  _Fwd_list_node_base *local_f0;
  list<int,_std::allocator<int>_> *local_e8;
  _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
  *local_e0;
  undefined1 local_d8 [24];
  list<int,_std::allocator<int>_> local_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_a8;
  _Rb_tree_node_base local_a0;
  size_t local_80;
  list<int,_std::allocator<int>_> local_78;
  _Rb_tree<std::__cxx11::list<int,_std::allocator<int>_>,_std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  local_60;
  
  __return_storage_ptr__->_start = START;
  plVar1 = &__return_storage_ptr__->_finalStates;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)plVar1;
  (__return_storage_ptr__->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
  ._M_size = 0;
  p_Var2 = &(__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_transTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130 = &(__return_storage_ptr__->_defaultTrans)._M_h;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_buckets =
       &(__return_storage_ptr__->_defaultTrans)._M_h._M_single_bucket;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_element_count = 0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_defaultTrans)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_158 = &__return_storage_ptr__->_uniqueChars;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)local_158;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)local_158;
  (__return_storage_ptr__->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl.
  _M_node._M_size = 0;
  local_d8._0_8_ = local_d8;
  local_d8._16_8_ = 0;
  local_110._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_110;
  local_110._M_impl._M_node._M_size = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)&local_78;
  local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  local_160 = __return_storage_ptr__;
  local_110._M_impl._M_node.super__List_node_base._M_prev =
       local_110._M_impl._M_node.super__List_node_base._M_next;
  local_d8._8_8_ = local_d8._0_8_;
  local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
       = local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var10[1]._M_next = nfa->_initialState;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size + 1;
  local_f8 = nfa;
  EpsilonClosure(&local_c0,nfa,&local_78);
  p_Var11 = std::__cxx11::
            list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
            ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                      ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                        *)&local_110,&local_c0);
  std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
  local_110._M_impl._M_node._M_size = local_110._M_impl._M_node._M_size + 1;
  pmVar12 = std::
            map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
            ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          *)&local_60,&local_c0);
  *pmVar12 = 0;
  local_e8 = plVar1;
  if (local_110._M_impl._M_node._M_size != 0) {
    plVar1 = &local_f8->_finalStates;
    local_e0 = (_Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                *)&local_160->_transTable;
    iVar23 = 1;
    do {
      std::__cxx11::list<int,_std::allocator<int>_>::list
                (&local_128,
                 (list<int,_std::allocator<int>_> *)
                 (local_110._M_impl._M_node.super__List_node_base._M_next + 1));
      std::__cxx11::
      list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
      ::_M_erase((list<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                  *)&local_110,(iterator)local_110._M_impl._M_node.super__List_node_base._M_next);
      p_Var11 = std::__cxx11::
                list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                          ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                            *)local_d8,&local_128);
      std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
      local_d8._16_8_ = local_d8._16_8_ + 1;
      for (p_Var10 = local_128.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                     super__List_node_base._M_next; p_Var10 != (_List_node_base *)&local_128;
          p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
                    super__List_node_base._M_next) {
        for (p_Var20 = (plVar1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
                       super__List_node_base._M_next; p_Var20 != (_List_node_base *)plVar1;
            p_Var20 = p_Var20->_M_next) {
          if (*(int *)&p_Var10[1]._M_next == *(int *)&p_Var20[1]._M_next) {
            pmVar12 = std::
                      map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                    *)&local_60,&local_128);
            p_Var13 = (_List_node_base *)operator_new(0x18);
            *(mapped_type *)&p_Var13[1]._M_next = *pmVar12;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            psVar3 = &(local_160->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node._M_size;
            *psVar3 = *psVar3 + 1;
          }
        }
      }
      local_178 = (pair<std::pair<int,_char>,_int> *)0x0;
      iStack_170._M_current = (pair<std::pair<int,_char>,_int> *)0x0;
      local_168 = (pair<std::pair<int,_char>,_int> *)0x0;
      p_Var14 = (local_f8->_inputs).super__Fwd_list_base<char,_std::allocator<char>_>._M_impl.
                _M_head._M_next;
      if (p_Var14 == (_Fwd_list_node_base *)0x0) {
LAB_0010685e:
        local_a0._M_color = _S_red;
        local_a0._M_parent = (_Base_ptr)0x0;
        local_a0._M_left = &local_a0;
        local_80 = 0;
        local_a0._M_right = local_a0._M_left;
        if (iStack_170._M_current != local_178) {
          lVar24 = 8;
          uVar21 = 0;
          do {
            pmVar12 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_a8,(key_type *)((long)&(local_178->first).first + lVar24)
                                );
            *pmVar12 = *pmVar12 + 1;
            uVar21 = uVar21 + 1;
            uVar19 = ((long)iStack_170._M_current - (long)local_178 >> 2) * -0x5555555555555555;
            lVar24 = lVar24 + 0xc;
          } while (uVar21 <= uVar19 && uVar19 - uVar21 != 0);
          if (iStack_170._M_current != local_178) {
            lVar24 = 8;
            uVar21 = 0;
            do {
              pmVar12 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_a8,
                                   (key_type *)((long)&(local_178->first).first + lVar24));
              if (*pmVar12 == 1) {
                local_148[0].first = *(pair<int,_char> *)((long)local_178 + lVar24 + -8);
                local_148[0].second = *(mapped_type *)((long)&(local_178->first).first + lVar24);
                std::
                _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>(local_e0,local_148);
              }
              else {
                std::
                _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<int&,int&>
                          ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)local_130,(long)local_178 + lVar24 + -8,
                           (long)&(local_178->first).first + lVar24);
              }
              uVar21 = uVar21 + 1;
              uVar19 = ((long)iStack_170._M_current - (long)local_178 >> 2) * -0x5555555555555555;
              lVar24 = lVar24 + 0xc;
            } while (uVar21 <= uVar19 && uVar19 - uVar21 != 0);
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&local_a8);
      }
      else {
        local_14c = 0;
        do {
          nfa_00 = local_f8;
          local_f0 = p_Var14;
          LevenshteinNFA::Move
                    ((list<int,_std::allocator<int>_> *)local_148,local_f8,&local_128,
                     *(char *)&p_Var14[1]._M_next);
          EpsilonClosure((list<int,_std::allocator<int>_> *)&local_a8,nfa_00,
                         (list<int,_std::allocator<int>_> *)local_148);
          pVar9 = local_148[0].first;
          while (pVar9 != (pair<int,_char>)local_148) {
            pVar7 = *(pair<int,_char> *)pVar9;
            operator_delete((void *)pVar9,0x18);
            pVar9 = pVar7;
          }
          p_Var22 = local_a8;
          if (local_a8 !=
              (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)&local_a8) {
            for (p_Var10 = local_110._M_impl._M_node.super__List_node_base._M_next;
                p_Var10 != (_List_node_base *)&local_110; p_Var10 = p_Var10->_M_next) {
              if ((_Base_ptr)p_Var10[2]._M_next == local_a0._M_parent) {
                p_Var22 = (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_a8;
                p_Var20 = p_Var10 + 1;
                while( true ) {
                  p_Var22 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              **)&p_Var22->_M_impl;
                  p_Var20 = p_Var20->_M_next;
                  if (p_Var20 == p_Var10 + 1) break;
                  if ((p_Var22 ==
                       (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)&local_a8) ||
                     (*(int *)&p_Var20[1]._M_next !=
                      *(int *)&(p_Var22->_M_impl).super__Rb_tree_header._M_header._M_parent))
                  goto LAB_00106581;
                }
                if (p_Var22 ==
                    (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&local_a8) {
                  p_Var18 = local_a0._M_parent;
                  if (p_Var10 != (_List_node_base *)&local_110) goto LAB_00106621;
                  break;
                }
              }
LAB_00106581:
            }
            p_Var15 = (_Base_ptr)local_d8._0_8_;
            p_Var18 = (_Base_ptr)local_d8;
            if ((_Base_ptr)local_d8._0_8_ != (_Base_ptr)local_d8) {
              do {
                if (*(_Base_ptr *)(p_Var15 + 1) == local_a0._M_parent) {
                  p_Var22 = (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_a8;
                  p_Var18 = (_Base_ptr)&p_Var15->_M_left;
                  while( true ) {
                    p_Var22 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                **)&p_Var22->_M_impl;
                    p_Var18 = *(_Base_ptr *)p_Var18;
                    if (p_Var18 == (_Base_ptr)&p_Var15->_M_left) break;
                    if ((p_Var22 ==
                         (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_a8) ||
                       (*(int *)&p_Var18->_M_left !=
                        *(int *)&(p_Var22->_M_impl).super__Rb_tree_header._M_header._M_parent))
                    goto LAB_001065db;
                  }
                  if (p_Var22 ==
                      (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&local_a8) {
                    p_Var18 = (_Base_ptr)local_d8;
                    if (p_Var15 != p_Var18) goto LAB_00106621;
                    break;
                  }
                }
LAB_001065db:
                p_Var15 = *(_Base_ptr *)p_Var15;
                p_Var18 = local_a0._M_parent;
              } while (p_Var15 != (_Base_ptr)local_d8);
            }
            p_Var11 = std::__cxx11::
                      list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                      ::_M_create_node<std::__cxx11::list<int,std::allocator<int>>&>
                                ((list<std::__cxx11::list<int,std::allocator<int>>,std::allocator<std::__cxx11::list<int,std::allocator<int>>>>
                                  *)&local_110,(list<int,_std::allocator<int>_> *)&local_a8);
            std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
            local_110._M_impl._M_node._M_size = local_110._M_impl._M_node._M_size + 1;
            local_148[0].first.first = iVar23;
            std::
            _Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
            ::_M_emplace_unique<std::__cxx11::list<int,std::allocator<int>>&,int>
                      ((_Rb_tree<std::__cxx11::list<int,std::allocator<int>>,std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>,std::_Select1st<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>,std::less<std::__cxx11::list<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::list<int,std::allocator<int>>const,int>>>
                        *)&local_60,(list<int,_std::allocator<int>_> *)&local_a8,(int *)local_148);
            iVar23 = iVar23 + 1;
LAB_00106621:
            if ((*(byte *)&local_f0[1]._M_next | 2) == 0x7e) {
              pmVar12 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_60,&local_128);
              iVar16 = std::
                       _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_130,pmVar12);
              p_Var22 = local_a8;
              if (iVar16.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
                  (__node_type *)0x0) {
                pmVar12 = std::
                          map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                        *)&local_60,&local_128);
                pmVar17 = std::
                          map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                          ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                        *)&local_60,(key_type *)&local_a8);
                std::
                _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<int&,int&>
                          ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)local_130,pmVar12,pmVar17);
                local_14c = (uint)CONCAT71((int7)((ulong)p_Var18 >> 8),1);
                p_Var22 = local_a8;
                if (iStack_170._M_current != local_178) {
                  lVar24 = 0;
                  uVar21 = 0;
                  do {
                    iVar5 = *(int *)((long)&(local_178->first).first + lVar24);
                    pmVar12 = std::
                              map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                              ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                            *)&local_60,&local_128);
                    if ((iVar5 != *pmVar12) ||
                       (iVar5 = *(int *)((long)&local_178->second + lVar24),
                       pmVar12 = std::
                                 map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                 ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                               *)&local_60,(key_type *)&local_a8), iVar5 != *pmVar12
                       )) {
                      local_148[0].first =
                           *(pair<int,_char> *)((long)&(local_178->first).first + lVar24);
                      local_148[0].second = *(mapped_type *)((long)&local_178->second + lVar24);
                      std::
                      _Rb_tree<std::pair<int,char>,std::pair<std::pair<int,char>const,int>,std::_Select1st<std::pair<std::pair<int,char>const,int>>,std::less<std::pair<int,char>>,std::allocator<std::pair<std::pair<int,char>const,int>>>
                      ::_M_emplace_unique<std::pair<std::pair<int,char>,int>>(local_e0,local_148);
                    }
                    uVar21 = uVar21 + 1;
                    uVar19 = ((long)iStack_170._M_current - (long)local_178 >> 2) *
                             -0x5555555555555555;
                    lVar24 = lVar24 + 0xc;
                    p_Var22 = local_a8;
                  } while (uVar21 <= uVar19 && uVar19 - uVar21 != 0);
                }
              }
            }
            else {
              p_Var10 = (_List_node_base *)operator_new(0x18);
              p_Var14 = local_f0;
              *(undefined1 *)&p_Var10[1]._M_next = *(undefined1 *)&local_f0[1]._M_next;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              psVar3 = &(local_160->_uniqueChars).super__List_base<char,_std::allocator<char>_>.
                        _M_impl._M_node._M_size;
              *psVar3 = *psVar3 + 1;
              pmVar12 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_60,&local_128);
              mVar6 = *pmVar12;
              uVar4 = *(undefined1 *)&p_Var14[1]._M_next;
              pmVar12 = std::
                        map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::list<int,_std::allocator<int>_>,_int,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
                                      *)&local_60,(key_type *)&local_a8);
              local_148[0].first.second = uVar4;
              local_148[0].first.first = mVar6;
              local_148[0].first._5_3_ = 0;
              local_148[0].second = *pmVar12;
              if (iStack_170._M_current == local_168) {
                std::
                vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
                ::_M_realloc_insert<std::pair<std::pair<int,char>,int>>
                          ((vector<std::pair<std::pair<int,char>,int>,std::allocator<std::pair<std::pair<int,char>,int>>>
                            *)&local_178,iStack_170,local_148);
                p_Var22 = local_a8;
              }
              else {
                (iStack_170._M_current)->second = local_148[0].second;
                (iStack_170._M_current)->first = local_148[0].first;
                iStack_170._M_current = iStack_170._M_current + 1;
                p_Var22 = local_a8;
              }
            }
          }
          while (p_Var22 !=
                 (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&local_a8) {
            p_Var8 = *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       **)&p_Var22->_M_impl;
            operator_delete(p_Var22,0x18);
            p_Var22 = p_Var8;
          }
          p_Var14 = local_f0->_M_next;
        } while (p_Var14 != (_Fwd_list_node_base *)0x0);
        if ((local_14c & 1) == 0) goto LAB_0010685e;
      }
      if (local_178 != (pair<std::pair<int,_char>,_int> *)0x0) {
        operator_delete(local_178,(long)local_168 - (long)local_178);
      }
      p_Var10 = local_128.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next;
      while (p_Var10 != (_List_node_base *)&local_128) {
        p_Var20 = p_Var10->_M_next;
        operator_delete(p_Var10,0x18);
        p_Var10 = p_Var20;
      }
    } while (local_110._M_impl._M_node._M_size != 0);
  }
  plVar1 = local_e8;
  std::__cxx11::list<int,_std::allocator<int>_>::sort(local_e8);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(plVar1);
  std::__cxx11::list<char,_std::allocator<char>_>::sort(local_158);
  std::__cxx11::list<char,_std::allocator<char>_>::unique(local_158);
  while (p_Var10 = local_78.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next,
        local_c0.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
        _M_next != (_List_node_base *)&local_c0) {
    p_Var10 = (((_List_base<int,_std::allocator<int>_> *)
               &(local_c0.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
              _M_next;
    operator_delete(local_c0.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    local_c0.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var10;
  }
  while (p_Var10 != (_List_node_base *)&local_78) {
    p_Var20 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(p_Var10,0x18);
    p_Var10 = p_Var20;
  }
  std::
  _Rb_tree<std::__cxx11::list<int,_std::allocator<int>_>,_std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>,_std::less<std::__cxx11::list<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::list<int,_std::allocator<int>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear(&local_110);
  std::__cxx11::
  _List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
              *)local_d8);
  return local_160;
}

Assistant:

LevenshteinDFA LevenshteinDFA::SubsetConstruct(const LevenshteinNFA &nfa)
    {
        LevenshteinDFA dfa{};
        int num = 0;

        std::list<std::list<int>> markedStates;
        std::list<std::list<int>> unmarkedStates;

        std::map<std::list<int>, int> dfaStateNum;

        std::list<int> nfaInitial;
        nfaInitial.emplace_back(nfa._initialState);

        std::list<int> first = EpsilonClosure(nfa, nfaInitial);
        unmarkedStates.emplace_back(first);

        //the initial dfa state
        int dfaInitial = num++;
        dfaStateNum[first] = dfaInitial;

        while (unmarkedStates.size() != 0)
        {
            bool tag=false;
            std::list<int> aState = unmarkedStates.front();
            unmarkedStates.pop_front();

            markedStates.emplace_back(aState);

            //Kinda killer, should redo
            for (std::list<int>::iterator it = aState.begin(); it != aState.end();++it)
            {
                for (auto it2 = nfa._finalStates.begin(); it2 != nfa._finalStates.end();++it2)
                {
                    if (*it == *it2)
                    {
                        dfa._finalStates.emplace_back(dfaStateNum[aState]);
                    }
                }
            }
            std::vector<std::pair<std::pair<int,char>,int>> vec_tmp;
//            for each (char c in nfa->inputs)
            for  (const char &c : nfa._inputs)
            {
                std::list<int> next = EpsilonClosure(nfa, nfa.Move(aState, c));
                if (next.empty()) continue;
                if (std::find(unmarkedStates.begin(), unmarkedStates.end(), next) == unmarkedStates.end() &&
                    std::find(markedStates.begin(), markedStates.end(), next) == markedStates.end())
                {
                    unmarkedStates.emplace_back(next);
                    dfaStateNum.emplace(next, num++);
                }
                if (c != (char)LevenshteinNFA::Constants::Insertion && c != (char)LevenshteinNFA::Constants::Deletion)
                {
                    dfa._uniqueChars.emplace_back(c);
                    std::pair<int, char> transition = std::make_pair(dfaStateNum[aState],c);
                    vec_tmp.push_back(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                   // dfa->transTable->insert(std::pair<std::pair<int,char>,int>(transition,dfaStateNum[next]));
                }
                else
                {
                    auto it = dfa._defaultTrans.find(dfaStateNum[aState]);
                    //TODO 数字 ascli值太大
                    if (it == dfa._defaultTrans.end())
                    {
                        dfa._defaultTrans.emplace(dfaStateNum[aState], dfaStateNum[next]);
                        tag = true;
                        for(int i=0;i<vec_tmp.size();i++){
                            if(!(vec_tmp[i].first.first == dfaStateNum[aState]&& vec_tmp[i].second == dfaStateNum[next])){
                                dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                            }

                        }
                    }
                }
            }
            if(!tag){
                std::map<int,int> map_tmp;
                for(int i=0;i<vec_tmp.size();i++){
                        map_tmp[vec_tmp[i].second]++;
                }
                for(int i=0;i<vec_tmp.size();i++){
                    //printf("%d %d %d\n",vec_tmp[i].second,map_tmp[vec_tmp[i].second],vec_tmp.size());
                    if(map_tmp[vec_tmp[i].second]==1){
                        dfa._transTable.insert(std::pair<std::pair<int,char>,int>(vec_tmp[i].first,vec_tmp[i].second));
                    }
                    else{
                        dfa._defaultTrans.emplace(vec_tmp[i].first.first,vec_tmp[i].second);
                    }
                }
            }
        }
        dfa._finalStates.sort();
        dfa._finalStates.unique();
        dfa._uniqueChars.sort();
        dfa._uniqueChars.unique();
        return dfa;
    }